

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

ssize_t __thiscall
duckdb_parquet::EncryptionWithColumnKey::read
          (EncryptionWithColumnKey *this,int __fd,void *__buf,size_t __nbytes)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  undefined4 extraout_var;
  undefined8 *puVar5;
  undefined4 in_register_00000034;
  TProtocol *this_01;
  size_type __n;
  uint32_t _size128;
  int16_t fid;
  TType ftype;
  TType _etype131;
  string fname;
  uint local_7c;
  short local_76;
  int local_74;
  ulong local_70;
  EncryptionWithColumnKey *local_68;
  string *local_60;
  undefined1 local_54 [4];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this_01 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_01);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  iVar1 = (*this_01->_vptr_TProtocol[0x19])(this_01,&local_50);
  local_60 = &this->key_metadata;
  this_00 = &this->path_in_schema;
  local_70 = 0;
  local_68 = this;
  do {
    iVar2 = (*this_01->_vptr_TProtocol[0x1b])(this_01,&local_50,&local_74,&local_76);
    iVar2 = iVar2 + iVar1;
    if (local_74 == 0) {
      iVar1 = (*this_01->_vptr_TProtocol[0x1a])(this_01);
      if ((local_70 & 1) != 0) {
        if (local_50 != local_40) {
          operator_delete(local_50);
        }
        this_01->input_recursion_depth_ = this_01->input_recursion_depth_ - 1;
        return (ulong)(uint)(iVar1 + iVar2);
      }
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x30);
      puVar5[1] = puVar5 + 3;
      puVar5[2] = 0;
      *(undefined1 *)(puVar5 + 3) = 0;
      *puVar5 = &PTR__TException_019aa480;
      *(undefined4 *)(puVar5 + 5) = 1;
      __cxa_throw(puVar5,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                  duckdb_apache::thrift::TException::~TException);
    }
    if (local_76 == 2) {
      if (local_74 != 0xb) {
        iVar3 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
        goto LAB_010ab06d;
      }
      iVar3 = (*this_01->_vptr_TProtocol[0x2b])(this_01,local_60);
      iVar3 = iVar3 + iVar2;
      local_68->__isset = (_EncryptionWithColumnKey__isset)((byte)local_68->__isset | 1);
    }
    else {
      if (local_76 == 1) {
        if (local_74 == 0xf) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00);
          iVar3 = (*this_01->_vptr_TProtocol[0x1f])(this_01,local_54,&local_7c);
          duckdb::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this_00,(ulong)local_7c);
          iVar3 = iVar3 + iVar2;
          if (local_7c != 0) {
            __n = 0;
            do {
              pvVar4 = duckdb::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       ::operator[](this_00,__n);
              iVar1 = (*this_01->_vptr_TProtocol[0x2a])(this_01,pvVar4);
              iVar3 = iVar3 + iVar1;
              __n = __n + 1;
            } while (__n < local_7c);
          }
          iVar1 = (*this_01->_vptr_TProtocol[0x20])(this_01);
          iVar3 = iVar1 + iVar3;
          local_70 = CONCAT71((int7)(CONCAT44(extraout_var,iVar1) >> 8),1);
          goto LAB_010ab072;
        }
        iVar3 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
      }
      else {
        iVar3 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
      }
LAB_010ab06d:
      iVar3 = iVar3 + iVar2;
    }
LAB_010ab072:
    iVar1 = (*this_01->_vptr_TProtocol[0x1c])(this_01);
    iVar1 = iVar1 + iVar3;
  } while( true );
}

Assistant:

uint32_t EncryptionWithColumnKey::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_path_in_schema = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->path_in_schema.clear();
            uint32_t _size128;
            ::apache::thrift::protocol::TType _etype131;
            xfer += iprot->readListBegin(_etype131, _size128);
            this->path_in_schema.resize(_size128);
            uint32_t _i132;
            for (_i132 = 0; _i132 < _size128; ++_i132)
            {
              xfer += iprot->readString(this->path_in_schema[_i132]);
            }
            xfer += iprot->readListEnd();
          }
          isset_path_in_schema = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readBinary(this->key_metadata);
          this->__isset.key_metadata = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_path_in_schema)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}